

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

void Vec_IntTwoMerge2(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vArr)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int *piVar7;
  long lVar8;
  size_t __size;
  int *piVar9;
  
  lVar8 = (long)vArr2->nSize + (long)vArr1->nSize;
  iVar6 = (int)lVar8;
  if (vArr->nCap < iVar6) {
    __size = lVar8 * 4;
    if (vArr->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(__size);
    }
    else {
      piVar4 = (int *)realloc(vArr->pArray,__size);
    }
    vArr->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vArr->nCap = iVar6;
  }
  piVar3 = vArr->pArray;
  piVar9 = vArr1->pArray;
  piVar5 = vArr2->pArray;
  piVar4 = piVar9 + vArr1->nSize;
  piVar1 = piVar5 + vArr2->nSize;
  piVar7 = piVar3;
  if (0 < vArr2->nSize && 0 < (long)vArr1->nSize) {
    do {
      iVar6 = *piVar9;
      iVar2 = *piVar5;
      if (iVar6 == iVar2) {
        piVar9 = piVar9 + 1;
        *piVar7 = iVar6;
        piVar5 = piVar5 + 1;
      }
      else if (iVar6 < iVar2) {
        piVar9 = piVar9 + 1;
        *piVar7 = iVar6;
      }
      else {
        piVar5 = piVar5 + 1;
        *piVar7 = iVar2;
      }
      piVar7 = piVar7 + 1;
    } while ((piVar9 < piVar4) && (piVar5 < piVar1));
  }
  for (; piVar9 < piVar4; piVar9 = piVar9 + 1) {
    *piVar7 = *piVar9;
    piVar7 = piVar7 + 1;
  }
  for (; piVar5 < piVar1; piVar5 = piVar5 + 1) {
    *piVar7 = *piVar5;
    piVar7 = piVar7 + 1;
  }
  iVar6 = (int)((ulong)((long)piVar7 - (long)piVar3) >> 2);
  vArr->nSize = iVar6;
  if (iVar6 <= vArr->nCap) {
    if (iVar6 < vArr1->nSize) {
      __assert_fail("vArr->nSize >= vArr1->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x741,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (iVar6 < vArr2->nSize) {
      __assert_fail("vArr->nSize >= vArr2->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x742,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    return;
  }
  __assert_fail("vArr->nSize <= vArr->nCap",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x740,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

static inline void Vec_IntTwoMerge2( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vArr )
{
    Vec_IntGrow( vArr, Vec_IntSize(vArr1) + Vec_IntSize(vArr2) );
    Vec_IntTwoMerge2Int( vArr1, vArr2, vArr );
}